

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O3

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,int N)

{
  undefined1 auVar1 [64];
  pointer piVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  pvVar3 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::__shared_ptr<std::vector<int,std::allocator<int>>,(__gnu_cxx::_Lock_policy)2>::
  reset<std::vector<int,std::allocator<int>>>
            ((__shared_ptr<std::vector<int,std::allocator<int>>,(__gnu_cxx::_Lock_policy)2> *)
             &this->indices_,pvVar3);
  std::vector<int,_std::allocator<int>_>::resize
            ((this->indices_).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(long)N);
  pvVar3 = (this->indices_).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (0 < N) {
    auVar5 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar7 = vpmovsxbd_avx512f(_DAT_001e2090);
    auVar8 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar9 = vpbroadcastd_avx512f(ZEXT416(0x10));
    piVar2 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    auVar10 = vpbroadcastq_avx512f();
    lVar4 = 0;
    do {
      vpcmpuq_avx512f(auVar6,auVar10,2);
      vpcmpuq_avx512f(auVar5,auVar10,2);
      auVar6 = vpaddq_avx512f(auVar6,auVar8);
      auVar5 = vpaddq_avx512f(auVar5,auVar8);
      auVar1 = vmovdqu32_avx512f(auVar7);
      *(undefined1 (*) [64])((long)piVar2 + lVar4) = auVar1;
      auVar7 = vpaddd_avx512f(auVar7,auVar9);
      lVar4 = lVar4 + 0x40;
    } while ((ulong)(N + 0xfU >> 4) << 6 != lVar4);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->shuffled_indices_,pvVar3);
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::setUniformIndices(int N)
{
  indices_.reset( new std::vector<int>() );
  indices_->resize(N);
  for( int i = 0; i < N; ++i )
    (*indices_)[i] = i;
  shuffled_indices_ = *indices_;
}